

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

void Abc_FlowRetime_UpdateForwardInit(Abc_Ntk_t *pNtk)

{
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  if (pManMR->fVerbose != 0) {
    printf("\t\tupdating init state\n");
  }
  Abc_NtkIncrementTravId(pNtk);
  for (local_24 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar2; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkBox(pNtk,local_24);
    iVar2 = Abc_ObjIsLatch(pObj_00);
    if (iVar2 != 0) {
      pObj_01 = Abc_ObjFanin0(pObj_00);
      Abc_FlowRetime_UpdateForwardInit_rec(pObj_01);
      pFVar1 = pManMR->pDataArray;
      uVar3 = Abc_ObjId(pObj_01);
      if ((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x20) ==
          (undefined1  [24])0x0) {
        pFVar1 = pManMR->pDataArray;
        uVar3 = Abc_ObjId(pObj_01);
        if ((undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x40) ==
            (undefined1  [24])0x0) {
          Abc_LatchSetInitDc(pObj_00);
        }
        else {
          Abc_LatchSetInit1(pObj_00);
        }
      }
      else {
        Abc_LatchSetInit0(pObj_00);
      }
    }
  }
  return;
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pObj, *pFanin;
  int i;

  vprintf("\t\tupdating init state\n");

  Abc_NtkIncrementTravId( pNtk );

  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pFanin = Abc_ObjFanin0(pObj);
    Abc_FlowRetime_UpdateForwardInit_rec( pFanin );

    if (FTEST(pFanin, INIT_0))
      Abc_LatchSetInit0( pObj );
    else if (FTEST(pFanin, INIT_1))
      Abc_LatchSetInit1( pObj );
    else
      Abc_LatchSetInitDc( pObj );
  }
}